

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void PrintSumm(char *type,int nfail,int nrun,int nerrs)

{
  int nerrs_local;
  int nrun_local;
  int nfail_local;
  char *type_local;
  
  if (nfail < 1) {
    printf("All tests for %3s driver passed the threshold (%6d tests run)\n",type,(ulong)(uint)nrun)
    ;
  }
  else {
    printf("%3s driver: %d out of %d tests failed to pass the threshold\n",type,(ulong)(uint)nfail,
           (ulong)(uint)nrun);
  }
  if (0 < nerrs) {
    printf("%6d error messages recorded\n",(ulong)(uint)nerrs);
  }
  return;
}

Assistant:

void
PrintSumm(const char *type, int nfail, int nrun, int nerrs)
{
    if ( nfail > 0 )
	printf("%3s driver: %d out of %d tests failed to pass the threshold\n",
	       type, nfail, nrun);
    else
	printf("All tests for %3s driver passed the threshold (%6d tests run)\n", type, nrun);

    if ( nerrs > 0 )
	printf("%6d error messages recorded\n", nerrs);
}